

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeL(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  int n;
  int in_ESI;
  long in_RDI;
  float fVar2;
  int w;
  
  iVar1 = *(int *)(in_RDI + 4);
  n = -iVar1;
  if (in_ESI != 1) {
    fVar2 = accumulate(*(float **)(in_RDI + 0x18),n);
    *(float *)(*(long *)(in_RDI + 0x18) + (long)n * 4) =
         fVar2 + *(float *)(*(long *)(in_RDI + 0x18) + (long)n * 4);
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (long)n * 4;
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + iVar1;
  *(undefined4 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

void mergeL(BorderMode mode)
    {
        int w = -u;
        if (mode != m_black)
            ku[w] += accumulate(ku, w);
        ku += w;
        uw -= w;
        u = 0;
    }